

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::TrimCapabilitiesPass::Process(TrimCapabilitiesPass *this)

{
  bool bVar1;
  Status SVar2;
  Status SVar3;
  type *required_capabilities_00;
  type *required_extensions_00;
  Status extStatus;
  Status capStatus;
  type *required_extensions;
  type *required_capabilities;
  TrimCapabilitiesPass *local_18;
  TrimCapabilitiesPass *this_local;
  
  local_18 = this;
  bVar1 = HasForbiddenCapabilities(this);
  if (bVar1) {
    this_local._4_4_ = SuccessWithoutChange;
  }
  else {
    DetermineRequiredCapabilitiesAndExtensions
              ((pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_> *)
               &required_capabilities,this);
    required_capabilities_00 =
         std::get<0ul,spvtools::EnumSet<spv::Capability>,spvtools::EnumSet<spvtools::Extension>>
                   ((pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_>
                     *)&required_capabilities);
    required_extensions_00 =
         std::get<1ul,spvtools::EnumSet<spv::Capability>,spvtools::EnumSet<spvtools::Extension>>
                   ((pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_>
                     *)&required_capabilities);
    SVar2 = TrimUnrequiredCapabilities(this,required_capabilities_00);
    SVar3 = TrimUnrequiredExtensions(this,required_extensions_00);
    this_local._4_4_ = SuccessWithoutChange;
    if (SVar2 == SuccessWithChange || SVar3 == SuccessWithChange) {
      this_local._4_4_ = SuccessWithChange;
    }
    std::pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_>::~pair
              ((pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_> *)
               &required_capabilities);
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status TrimCapabilitiesPass::Process() {
  if (HasForbiddenCapabilities()) {
    return Status::SuccessWithoutChange;
  }

  auto[required_capabilities, required_extensions] =
      DetermineRequiredCapabilitiesAndExtensions();

  Pass::Status capStatus = TrimUnrequiredCapabilities(required_capabilities);
  Pass::Status extStatus = TrimUnrequiredExtensions(required_extensions);

  return capStatus == Pass::Status::SuccessWithChange ||
                 extStatus == Pass::Status::SuccessWithChange
             ? Pass::Status::SuccessWithChange
             : Pass::Status::SuccessWithoutChange;
}